

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

void ncnn::to_rgba(Mat *m,uchar *rgba,int stride)

{
  float *pfVar1;
  Mat *this;
  int *piVar2;
  int in_EDX;
  undefined1 *in_RSI;
  long in_RDI;
  int remain;
  int y;
  float *ptr3;
  float *ptr2;
  float *ptr1;
  float *ptr0;
  int wgap;
  int h;
  int w;
  undefined8 in_stack_fffffffffffffe70;
  int iVar3;
  Mat *in_stack_fffffffffffffe78;
  int local_178 [3];
  int local_16c [3];
  int local_160 [3];
  int local_154 [3];
  int local_148;
  int local_144;
  Mat local_140;
  float *local_100;
  Mat local_f8;
  Mat *local_b8;
  Mat local_b0;
  float *local_70;
  Mat local_68;
  float *local_28;
  int local_20;
  int local_1c;
  int local_18;
  undefined1 *local_10;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffe70 >> 0x20);
  local_18 = *(int *)(in_RDI + 0x2c);
  local_1c = *(int *)(in_RDI + 0x30);
  local_20 = in_EDX + local_18 * -4;
  if (local_20 == 0) {
    local_18 = local_18 * local_1c;
    local_1c = 1;
  }
  local_10 = in_RSI;
  Mat::channel(in_stack_fffffffffffffe78,iVar3);
  pfVar1 = Mat::operator_cast_to_float_(&local_68);
  Mat::~Mat((Mat *)0x126cfc);
  local_28 = pfVar1;
  Mat::channel(in_stack_fffffffffffffe78,iVar3);
  pfVar1 = Mat::operator_cast_to_float_(&local_b0);
  Mat::~Mat((Mat *)0x126d41);
  local_70 = pfVar1;
  Mat::channel(in_stack_fffffffffffffe78,(int)((ulong)pfVar1 >> 0x20));
  iVar3 = (int)((ulong)pfVar1 >> 0x20);
  this = (Mat *)Mat::operator_cast_to_float_(&local_f8);
  Mat::~Mat((Mat *)0x126d87);
  local_b8 = this;
  Mat::channel(this,iVar3);
  pfVar1 = Mat::operator_cast_to_float_(&local_140);
  Mat::~Mat((Mat *)0x126dc4);
  local_100 = pfVar1;
  for (local_144 = 0; local_144 < local_1c; local_144 = local_144 + 1) {
    for (local_148 = local_18; 0 < local_148; local_148 = local_148 + -1) {
      local_154[2] = (int)*local_28;
      local_154[1] = 0;
      piVar2 = std::max<int>(local_154 + 2,local_154 + 1);
      local_154[0] = 0xff;
      piVar2 = std::min<int>(piVar2,local_154);
      *local_10 = (char)*piVar2;
      local_160[2] = (int)*local_70;
      local_160[1] = 0;
      piVar2 = std::max<int>(local_160 + 2,local_160 + 1);
      local_160[0] = 0xff;
      piVar2 = std::min<int>(piVar2,local_160);
      local_10[1] = (char)*piVar2;
      local_16c[2] = (int)*(float *)&local_b8->data;
      local_16c[1] = 0;
      piVar2 = std::max<int>(local_16c + 2,local_16c + 1);
      local_16c[0] = 0xff;
      piVar2 = std::min<int>(piVar2,local_16c);
      local_10[2] = (char)*piVar2;
      local_178[2] = (int)*local_100;
      local_178[1] = 0;
      piVar2 = std::max<int>(local_178 + 2,local_178 + 1);
      local_178[0] = 0xff;
      piVar2 = std::min<int>(piVar2,local_178);
      local_10[3] = (char)*piVar2;
      local_10 = local_10 + 4;
      local_28 = local_28 + 1;
      local_70 = local_70 + 1;
      local_b8 = (Mat *)((long)&local_b8->data + 4);
      local_100 = local_100 + 1;
    }
    local_10 = local_10 + local_20;
  }
  return;
}

Assistant:

static void to_rgba(const Mat& m, unsigned char* rgba, int stride)
{
    int w = m.w;
    int h = m.h;

    const int wgap = stride - w * 4;
    if (wgap == 0)
    {
        w = w * h;
        h = 1;
    }

    const float* ptr0 = m.channel(0);
    const float* ptr1 = m.channel(1);
    const float* ptr2 = m.channel(2);
    const float* ptr3 = m.channel(3);

    for (int y=0; y<h; y++)
    {
#define SATURATE_CAST_UCHAR(X) (unsigned char)::std::min(::std::max((int)(X), 0), 255);

        int remain = w;

        for (; remain>0; remain--)
        {
            rgba[0] = SATURATE_CAST_UCHAR(*ptr0);
            rgba[1] = SATURATE_CAST_UCHAR(*ptr1);
            rgba[2] = SATURATE_CAST_UCHAR(*ptr2);
            rgba[3] = SATURATE_CAST_UCHAR(*ptr3);

            rgba += 4;
            ptr0++;
            ptr1++;
            ptr2++;
            ptr3++;
        }

#undef SATURATE_CAST_UCHAR
        rgba += wgap;
    }
}